

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O1

string * __thiscall
TgBot::TgTypeParser::parseInlineQueryResultAudio_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  char cVar3;
  string *psVar4;
  string local_40;
  
  peVar2 = (object->super___shared_ptr<TgBot::InlineQueryResultAudio,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (peVar2 == (element_type *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    paVar1 = &local_40.field_2;
    psVar4 = &local_40;
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)psVar4,"audio_url","");
    appendToJson((TgTypeParser *)psVar4,__return_storage_ptr__,&local_40,
                 &((object->
                   super___shared_ptr<TgBot::InlineQueryResultAudio,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->audioUrl);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    psVar4 = &local_40;
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)psVar4,"performer","");
    appendToJson((TgTypeParser *)psVar4,__return_storage_ptr__,&local_40,
                 &((object->
                   super___shared_ptr<TgBot::InlineQueryResultAudio,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->performer);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"audio_duration","");
    cVar3 = (char)__return_storage_ptr__;
    std::__cxx11::string::push_back(cVar3);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_40._M_dataplus._M_p)
    ;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::push_back(cVar3);
    std::__cxx11::string::push_back(cVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TgTypeParser::parseInlineQueryResultAudio(const InlineQueryResultAudio::Ptr& object) const {
    if (!object){
        return "";
    }
    // This function will be called by parseInlineQueryResult(), so I don't add
    // curly brackets to the result string.
    string result;
    appendToJson(result, "audio_url", object->audioUrl);
    appendToJson(result, "performer", object->performer);
    appendToJson(result, "audio_duration", object->audioDuration);
    // The last comma will be erased by parseInlineQueryResult().
    return result;
}